

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O0

int cvLs_AccessLMem(void *cvode_mem,char *fname,CVodeMem *cv_mem,CVLsMem *cvls_mem)

{
  undefined8 *in_RCX;
  long *in_RDX;
  char *in_RSI;
  long in_RDI;
  int local_4;
  
  if (in_RDI == 0) {
    cvProcessError((CVodeMem)0x0,-1,"CVLS",in_RSI,"Integrator memory is NULL.");
    local_4 = -1;
  }
  else {
    *in_RDX = in_RDI;
    if (*(long *)(*in_RDX + 0x408) == 0) {
      cvProcessError((CVodeMem)*in_RDX,-2,"CVLS",in_RSI,"Linear solver memory is NULL.");
      local_4 = -2;
    }
    else {
      *in_RCX = *(undefined8 *)(*in_RDX + 0x408);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int cvLs_AccessLMem(void* cvode_mem, const char *fname,
                    CVodeMem *cv_mem, CVLsMem *cvls_mem)
{
  if (cvode_mem==NULL) {
    cvProcessError(NULL, CVLS_MEM_NULL, "CVLS",
                   fname, MSG_LS_CVMEM_NULL);
    return(CVLS_MEM_NULL);
  }
  *cv_mem = (CVodeMem) cvode_mem;
  if ((*cv_mem)->cv_lmem==NULL) {
    cvProcessError(*cv_mem, CVLS_LMEM_NULL, "CVLS",
                   fname, MSG_LS_LMEM_NULL);
    return(CVLS_LMEM_NULL);
  }
  *cvls_mem = (CVLsMem) (*cv_mem)->cv_lmem;
  return(CVLS_SUCCESS);
}